

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::PrimReserve(ImDrawList *this,int idx_count,int vtx_count)

{
  int *piVar1;
  ImDrawCmd *pIVar2;
  int iVar3;
  int iVar4;
  ImDrawVert *pIVar5;
  unsigned_short *puVar6;
  ImGuiContext *pIVar7;
  ImDrawVert *__dest;
  unsigned_short *__dest_00;
  int iVar8;
  int iVar9;
  
  pIVar2 = (this->CmdBuffer).Data + (long)(this->CmdBuffer).Size + -1;
  pIVar2->ElemCount = pIVar2->ElemCount + idx_count;
  pIVar7 = GImGui;
  iVar3 = (this->VtxBuffer).Size;
  iVar9 = vtx_count + iVar3;
  iVar4 = (this->VtxBuffer).Capacity;
  if (iVar4 < iVar9) {
    if (iVar4 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar4 / 2 + iVar4;
    }
    if (iVar8 <= iVar9) {
      iVar8 = iVar9;
    }
    if (iVar4 < iVar8) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      __dest = (ImDrawVert *)(*(pIVar7->IO).MemAllocFn)((long)iVar8 * 0x14);
      pIVar5 = (this->VtxBuffer).Data;
      if (pIVar5 != (ImDrawVert *)0x0) {
        memcpy(__dest,pIVar5,(long)(this->VtxBuffer).Size * 0x14);
      }
      pIVar5 = (this->VtxBuffer).Data;
      if (pIVar5 != (ImDrawVert *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar5);
      (this->VtxBuffer).Data = __dest;
      (this->VtxBuffer).Capacity = iVar8;
    }
  }
  (this->VtxBuffer).Size = iVar9;
  this->_VtxWritePtr = (this->VtxBuffer).Data + iVar3;
  pIVar7 = GImGui;
  iVar3 = (this->IdxBuffer).Size;
  iVar9 = idx_count + iVar3;
  iVar4 = (this->IdxBuffer).Capacity;
  if (iVar4 < iVar9) {
    if (iVar4 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar4 / 2 + iVar4;
    }
    if (iVar8 <= iVar9) {
      iVar8 = iVar9;
    }
    if (iVar4 < iVar8) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      __dest_00 = (unsigned_short *)(*(pIVar7->IO).MemAllocFn)((long)iVar8 * 2);
      puVar6 = (this->IdxBuffer).Data;
      if (puVar6 != (unsigned_short *)0x0) {
        memcpy(__dest_00,puVar6,(long)(this->IdxBuffer).Size * 2);
      }
      puVar6 = (this->IdxBuffer).Data;
      if (puVar6 != (unsigned_short *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(puVar6);
      (this->IdxBuffer).Data = __dest_00;
      (this->IdxBuffer).Capacity = iVar8;
    }
  }
  (this->IdxBuffer).Size = iVar9;
  this->_IdxWritePtr = (this->IdxBuffer).Data + iVar3;
  return;
}

Assistant:

void ImDrawList::PrimReserve(int idx_count, int vtx_count)
{
    ImDrawCmd& draw_cmd = CmdBuffer.Data[CmdBuffer.Size-1];
    draw_cmd.ElemCount += idx_count;

    int vtx_buffer_size = VtxBuffer.Size;
    VtxBuffer.resize(vtx_buffer_size + vtx_count);
    _VtxWritePtr = VtxBuffer.Data + vtx_buffer_size;

    int idx_buffer_size = IdxBuffer.Size;
    IdxBuffer.resize(idx_buffer_size + idx_count);
    _IdxWritePtr = IdxBuffer.Data + idx_buffer_size;
}